

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlSchemaAttributeUsePtr_conflict
xmlSchemaAddAttributeUse(xmlSchemaParserCtxtPtr pctxt,xmlNodePtr node)

{
  int iVar1;
  xmlSchemaParserCtxtPtr local_28;
  xmlSchemaAttributeUsePtr_conflict ret;
  xmlNodePtr node_local;
  xmlSchemaParserCtxtPtr pctxt_local;
  
  if (pctxt == (xmlSchemaParserCtxtPtr)0x0) {
    pctxt_local = (xmlSchemaParserCtxtPtr)0x0;
  }
  else {
    local_28 = (xmlSchemaParserCtxtPtr)(*xmlMalloc)(0x48);
    if (local_28 == (xmlSchemaParserCtxtPtr)0x0) {
      xmlSchemaPErrMemory(pctxt);
      pctxt_local = (xmlSchemaParserCtxtPtr)0x0;
    }
    else {
      memset(local_28,0,0x48);
      local_28->type = 0x1a;
      local_28->serror = (xmlStructuredErrorFunc)node;
      if (local_28 != (xmlSchemaParserCtxtPtr)0x0) {
        iVar1 = xmlSchemaAddItemSize(&pctxt->constructor->bucket->locals,10,local_28);
        if (iVar1 < 0) {
          xmlSchemaPErrMemory(pctxt);
          (*xmlFree)(local_28);
          local_28 = (xmlSchemaParserCtxtPtr)0x0;
        }
      }
      pctxt_local = local_28;
    }
  }
  return (xmlSchemaAttributeUsePtr_conflict)pctxt_local;
}

Assistant:

static xmlSchemaAttributeUsePtr
xmlSchemaAddAttributeUse(xmlSchemaParserCtxtPtr pctxt,
			 xmlNodePtr node)
{
    xmlSchemaAttributeUsePtr ret = NULL;

    if (pctxt == NULL)
        return (NULL);

    ret = (xmlSchemaAttributeUsePtr) xmlMalloc(sizeof(xmlSchemaAttributeUse));
    if (ret == NULL) {
        xmlSchemaPErrMemory(pctxt);
        return (NULL);
    }
    memset(ret, 0, sizeof(xmlSchemaAttributeUse));
    ret->type = XML_SCHEMA_TYPE_ATTRIBUTE_USE;
    ret->node = node;

    WXS_ADD_LOCAL(pctxt, ret);
    return (ret);
}